

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionPosition_line.cpp
# Opt level: O2

void __thiscall
chrono::ChFunctionPosition_line::ArchiveOUT(ChFunctionPosition_line *this,ChArchiveOut *marchive)

{
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_48;
  ChNameValue<std::shared_ptr<chrono::geometry::ChLine>_> local_30;
  
  ChArchiveOut::VersionWrite<chrono::ChFunctionPosition>(marchive);
  ChFunctionPosition::ArchiveOUT(&this->super_ChFunctionPosition,marchive);
  local_30._value = &this->trajectory_line;
  local_30._name = "trajectory_line";
  local_30._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = &this->space_fx;
  local_48._name = "space_fx";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_48);
  return;
}

Assistant:

void ChFunctionPosition_line::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChFunctionPosition>();
	// serialize parent class
    ChFunctionPosition::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(trajectory_line);
	marchive << CHNVP(space_fx);

}